

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

bool __thiscall
gss::innards::HomomorphismSearcher::propagate_simple_constraints
          (HomomorphismSearcher *this,Domains *new_domains,
          HomomorphismAssignment *current_assignment)

{
  Injectivity IVar1;
  pointer pHVar2;
  Proof *pPVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  HomomorphismDomain *d;
  pointer d_00;
  
  pHVar2 = (new_domains->
           super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (d_00 = (new_domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start; d_00 != pHVar2; d_00 = d_00 + 1) {
    if (d_00->fixed == false) {
      IVar1 = this->params->injectivity;
      if (IVar1 == Injective) {
LAB_00130b8c:
        SVOBitset::reset(&d_00->values,current_assignment->target_vertex);
      }
      else if (IVar1 == LocallyInjective) {
        bVar4 = both_in_the_neighbourhood_of_some_vertex
                          (this,current_assignment->pattern_vertex,d_00->v);
        if (bVar4) goto LAB_00130b8c;
      }
      bVar5 = HomomorphismModel::has_edge_labels(this->model);
      bVar4 = this->params->induced;
      if (bVar5) {
        pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (bVar4 == false) {
          if (pPVar3 != (Proof *)0x0) {
            bVar4 = Proof::super_extra_verbose(pPVar3);
            if (bVar4) {
              propagate_adjacency_constraints<true,true,false,true>(this,d_00,current_assignment);
              goto LAB_00130d0b;
            }
          }
          propagate_adjacency_constraints<true,true,false,false>(this,d_00,current_assignment);
        }
        else {
          if (pPVar3 != (Proof *)0x0) {
            bVar4 = Proof::super_extra_verbose(pPVar3);
            if (bVar4) {
              propagate_adjacency_constraints<true,true,true,true>(this,d_00,current_assignment);
              goto LAB_00130d0b;
            }
          }
          propagate_adjacency_constraints<true,true,true,false>(this,d_00,current_assignment);
        }
      }
      else {
        bVar5 = HomomorphismModel::directed(this->model);
        pPVar3 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (bVar4 == false) {
          if (bVar5) {
            if (pPVar3 != (Proof *)0x0) {
              bVar4 = Proof::super_extra_verbose(pPVar3);
              if (bVar4) {
                propagate_adjacency_constraints<true,false,false,true>(this,d_00,current_assignment)
                ;
                goto LAB_00130d0b;
              }
            }
            propagate_adjacency_constraints<true,false,false,false>(this,d_00,current_assignment);
          }
          else {
            if (pPVar3 != (Proof *)0x0) {
              bVar4 = Proof::super_extra_verbose(pPVar3);
              if (bVar4) {
                propagate_adjacency_constraints<false,false,false,true>
                          (this,d_00,current_assignment);
                goto LAB_00130d0b;
              }
            }
            propagate_adjacency_constraints<false,false,false,false>(this,d_00,current_assignment);
          }
        }
        else if (bVar5) {
          if (pPVar3 != (Proof *)0x0) {
            bVar4 = Proof::super_extra_verbose(pPVar3);
            if (bVar4) {
              propagate_adjacency_constraints<true,false,true,true>(this,d_00,current_assignment);
              goto LAB_00130d0b;
            }
          }
          propagate_adjacency_constraints<true,false,true,false>(this,d_00,current_assignment);
        }
        else {
          if (pPVar3 != (Proof *)0x0) {
            bVar4 = Proof::super_extra_verbose(pPVar3);
            if (bVar4) {
              propagate_adjacency_constraints<false,false,true,true>(this,d_00,current_assignment);
              goto LAB_00130d0b;
            }
          }
          propagate_adjacency_constraints<false,false,true,false>(this,d_00,current_assignment);
        }
      }
LAB_00130d0b:
      uVar6 = SVOBitset::count(&d_00->values);
      d_00->count = uVar6;
      if (uVar6 == 0) break;
    }
  }
  return d_00 == pHVar2;
}

Assistant:

auto HomomorphismSearcher::propagate_simple_constraints(Domains & new_domains, const HomomorphismAssignment & current_assignment) -> bool
{
    // propagate for each remaining domain...
    for (auto & d : new_domains) {
        if (d.fixed)
            continue;

        // injectivity
        switch (params.injectivity) {
        case Injectivity::Injective:
            d.values.reset(current_assignment.target_vertex);
            break;
        case Injectivity::LocallyInjective:
            if (both_in_the_neighbourhood_of_some_vertex(current_assignment.pattern_vertex, d.v))
                d.values.reset(current_assignment.target_vertex);
            break;
        case Injectivity::NonInjective:
            break;
        }

        // adjacency
        if (! model.has_edge_labels()) {
            if (params.induced) {
                if (model.directed()) {
                    if ((! proof) || (! proof->super_extra_verbose()))
                        propagate_adjacency_constraints<true, false, true, false>(d, current_assignment);
                    else
                        propagate_adjacency_constraints<true, false, true, true>(d, current_assignment);
                }
                else {
                    if ((! proof) || (! proof->super_extra_verbose()))
                        propagate_adjacency_constraints<false, false, true, false>(d, current_assignment);
                    else
                        propagate_adjacency_constraints<false, false, true, true>(d, current_assignment);
                }
            }
            else {
                if (model.directed()) {
                    if ((! proof) || (! proof->super_extra_verbose()))
                        propagate_adjacency_constraints<true, false, false, false>(d, current_assignment);
                    else
                        propagate_adjacency_constraints<true, false, false, true>(d, current_assignment);
                }
                else {
                    if ((! proof) || (! proof->super_extra_verbose()))
                        propagate_adjacency_constraints<false, false, false, false>(d, current_assignment);
                    else
                        propagate_adjacency_constraints<false, false, false, true>(d, current_assignment);
                }
            }
        }
        else {
            // edge labels are always directed
            if (params.induced) {
                if ((! proof) || (! proof->super_extra_verbose()))
                    propagate_adjacency_constraints<true, true, true, false>(d, current_assignment);
                else
                    propagate_adjacency_constraints<true, true, true, true>(d, current_assignment);
            }
            else {
                if ((! proof) || (! proof->super_extra_verbose()))
                    propagate_adjacency_constraints<true, true, false, false>(d, current_assignment);
                else
                    propagate_adjacency_constraints<true, true, false, true>(d, current_assignment);
            }
        }

        // we might have removed values
        d.count = d.values.count();
        if (0 == d.count)
            return false;
    }

    return true;
}